

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_getpath(void)

{
  char *path;
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  size_t sVar4;
  uv_fs_event_t *loop;
  long lVar5;
  size_t len;
  char buf [1024];
  size_t local_440;
  char local_438 [1032];
  
  puVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar5 = 0;
  do {
    iVar2 = uv_fs_event_init(puVar3,&fs_event);
    if (iVar2 != 0) {
LAB_00157cd4:
      run_test_fs_event_getpath_cold_1();
      goto LAB_00157cd9;
    }
    local_440 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    if (iVar2 != -0x16) {
LAB_00157ccf:
      run_test_fs_event_getpath_cold_2();
      goto LAB_00157cd4;
    }
    path = *(char **)((long)&DAT_001f7c10 + lVar5);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,path,0);
    if (iVar2 != 0) {
LAB_00157cca:
      run_test_fs_event_getpath_cold_3();
      goto LAB_00157ccf;
    }
    local_440 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    sVar1 = local_440;
    if (iVar2 != -0x69) {
LAB_00157cc5:
      run_test_fs_event_getpath_cold_4();
      goto LAB_00157cca;
    }
    if (0x3ff < local_440) {
LAB_00157cc0:
      run_test_fs_event_getpath_cold_5();
      goto LAB_00157cc5;
    }
    sVar4 = strlen(path);
    if (sVar1 != sVar4 + 1) {
LAB_00157cbb:
      run_test_fs_event_getpath_cold_6();
      goto LAB_00157cc0;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    sVar1 = local_440;
    if (iVar2 != 0) {
LAB_00157cb6:
      run_test_fs_event_getpath_cold_7();
      goto LAB_00157cbb;
    }
    sVar4 = strlen(path);
    if (sVar1 != sVar4) {
LAB_00157cb1:
      run_test_fs_event_getpath_cold_8();
      goto LAB_00157cb6;
    }
    iVar2 = strcmp(local_438,path);
    if (iVar2 != 0) {
LAB_00157cac:
      run_test_fs_event_getpath_cold_9();
      goto LAB_00157cb1;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
LAB_00157ca7:
      run_test_fs_event_getpath_cold_10();
      goto LAB_00157cac;
    }
    uv_close((uv_handle_t *)&fs_event,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_00157ca7;
    }
    close_cb_called = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x28);
  remove("watch_dir/");
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
LAB_00157cd9:
  run_test_fs_event_getpath_cold_12();
  puVar3 = uv_default_loop();
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  uv_run(puVar3,UV_RUN_DEFAULT);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_event_error_reporting_cold_1();
  loop = (uv_fs_event_t *)uv_default_loop();
  iVar2 = uv_fs_event_init((uv_loop_t *)loop,&fs_event);
  if (iVar2 == 0) {
    loop = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_00157de4;
    loop = &fs_event;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar2 != 0) goto LAB_00157de9;
    loop = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_00157dee;
    loop = &fs_event;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar2 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      loop = (uv_fs_event_t *)uv_default_loop();
      iVar2 = uv_loop_close((uv_loop_t *)loop);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00157df8;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00157de4:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00157de9:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00157dee:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_00157df8:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar2 = uv_is_closing((uv_handle_t *)loop);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_getpath) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned i;
  int r;
  char buf[1024];
  size_t len;
  const char* const watch_dir[] = {
    "watch_dir",
    "watch_dir/",
    "watch_dir///",
    "watch_dir/subfolder/..",
    "watch_dir//subfolder//..//",
  };

  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");


  for (i = 0; i < ARRAY_SIZE(watch_dir); i++) {
    r = uv_fs_event_init(loop, &fs_event);
    ASSERT(r == 0);
    len = sizeof buf;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_EINVAL);
    r = uv_fs_event_start(&fs_event, fail_cb, watch_dir[i], 0);
    ASSERT(r == 0);
    len = 0;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_ENOBUFS);
    ASSERT(len < sizeof buf); /* sanity check */
    ASSERT(len == strlen(watch_dir[i]) + 1);
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == 0);
    ASSERT(len == strlen(watch_dir[i]));
    ASSERT(strcmp(buf, watch_dir[i]) == 0);
    r = uv_fs_event_stop(&fs_event);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &fs_event, close_cb);

    uv_run(loop, UV_RUN_DEFAULT);

    ASSERT(close_cb_called == 1);
    close_cb_called = 0;
  }

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}